

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.hpp
# Opt level: O0

ssize_t __thiscall JEBDebug::Profiler::write(Profiler *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  bool bVar1;
  _Setw _Var2;
  _Setprecision _Var3;
  int *piVar4;
  size_type sVar5;
  ostream *poVar6;
  reference p_Var7;
  pointer ppVar8;
  size_t sVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  ssize_t sVar11;
  undefined4 in_register_00000034;
  double dVar12;
  _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
  local_a8;
  _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_> it_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
  *__range2_1;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  reference local_58;
  _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_> *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
  *__range2;
  int widths [5];
  _lambda_auto_1__2_ local_1a;
  _lambda_auto_1__1_ local_19;
  anon_class_1_0_00000001 float_width;
  ostream *poStack_18;
  anon_class_1_0_00000001 int_width;
  ostream *os_local;
  Profiler *this_local;
  
  poStack_18 = (ostream *)CONCAT44(in_register_00000034,__fd);
  __range2 = (vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
              *)0x300000005;
  widths[0] = 3;
  widths[1] = 3;
  widths[2] = 8;
  __end2 = std::
           vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
           ::begin(&this->sequence_);
  it = (_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
        *)std::
          vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
          ::end(&this->sequence_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>_>
                                *)&it);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>_>
               ::operator*(&__end2);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(local_58);
    sVar9 = ProfilerData::count(&ppVar8->second);
    local_5c = const::{lambda(auto:1)#1}::operator()(&local_19,sVar9);
    piVar4 = std::max<int>((int *)&__range2,&local_5c);
    __range2 = (vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
                *)CONCAT44(__range2._4_4_,*piVar4);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(local_58);
    dVar12 = ProfilerData::acc_time(&ppVar8->second);
    local_60 = const::{lambda(auto:1)#2}::operator()(&local_1a,dVar12);
    piVar4 = std::max<int>((int *)((long)&__range2 + 4),&local_60);
    __range2 = (vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
                *)CONCAT44(*piVar4,(int)__range2);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(local_58);
    dVar12 = ProfilerData::min_time(&ppVar8->second);
    local_64 = const::{lambda(auto:1)#2}::operator()(&local_1a,dVar12);
    piVar4 = std::max<int>(widths,&local_64);
    widths[0] = *piVar4;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(local_58);
    dVar12 = ProfilerData::max_time(&ppVar8->second);
    local_68 = const::{lambda(auto:1)#2}::operator()(&local_1a,dVar12);
    piVar4 = std::max<int>(widths + 1,&local_68);
    widths[1] = *piVar4;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(local_58);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&(ppVar8->first).func_name);
    local_6c = (int)sVar5;
    piVar4 = std::max<int>(widths + 2,&local_6c);
    widths[2] = *piVar4;
    __gnu_cxx::
    __normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>_>
    ::operator++(&__end2);
  }
  poVar6 = (ostream *)std::ostream::operator<<(poStack_18,std::right);
  _Var2 = std::setw((int)__range2);
  poVar6 = std::operator<<(poVar6,_Var2);
  poVar6 = std::operator<<(poVar6,"calls");
  poVar6 = std::operator<<(poVar6," ");
  _Var2 = std::setw(__range2._4_4_);
  poVar6 = std::operator<<(poVar6,_Var2);
  poVar6 = std::operator<<(poVar6,"sum");
  poVar6 = std::operator<<(poVar6," ");
  _Var2 = std::setw(widths[0]);
  poVar6 = std::operator<<(poVar6,_Var2);
  poVar6 = std::operator<<(poVar6,"min");
  poVar6 = std::operator<<(poVar6," ");
  _Var2 = std::setw(widths[1]);
  poVar6 = std::operator<<(poVar6,_Var2);
  poVar6 = std::operator<<(poVar6,"max");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::left);
  poVar6 = std::operator<<(poVar6,"  ");
  _Var2 = std::setw(widths[2]);
  poVar6 = std::operator<<(poVar6,_Var2);
  poVar6 = std::operator<<(poVar6,"function");
  std::operator<<(poVar6,"  file\n");
  poVar6 = poStack_18;
  _Var3 = std::setprecision(4);
  poVar6 = std::operator<<(poVar6,_Var3);
  std::ostream::operator<<(poVar6,std::fixed);
  __end2_1 = std::
             vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
             ::begin(&this->sequence_);
  it_1._M_node = (_Base_ptr)
                 std::
                 vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
                 ::end(&this->sequence_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>_>
                        *)&it_1);
    if (!bVar1) break;
    p_Var7 = __gnu_cxx::
             __normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>_>
             ::operator*(&__end2_1);
    local_a8._M_node = p_Var7->_M_node;
    poVar6 = (ostream *)std::ostream::operator<<(poStack_18,std::right);
    _Var2 = std::setw((int)__range2);
    poVar6 = std::operator<<(poVar6,_Var2);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(&local_a8);
    sVar9 = ProfilerData::count(&ppVar8->second);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar9);
    poVar6 = std::operator<<(poVar6," ");
    _Var2 = std::setw(__range2._4_4_);
    poVar6 = std::operator<<(poVar6,_Var2);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(&local_a8);
    dVar12 = ProfilerData::acc_time(&ppVar8->second);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar12);
    poVar6 = std::operator<<(poVar6," ");
    _Var2 = std::setw(widths[0]);
    poVar6 = std::operator<<(poVar6,_Var2);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(&local_a8);
    dVar12 = ProfilerData::min_time(&ppVar8->second);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar12);
    poVar6 = std::operator<<(poVar6," ");
    _Var2 = std::setw(widths[1]);
    poVar6 = std::operator<<(poVar6,_Var2);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(&local_a8);
    dVar12 = ProfilerData::max_time(&ppVar8->second);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar12);
    poVar6 = std::operator<<(poVar6,"  ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::left);
    _Var2 = std::setw(widths[2]);
    poVar6 = std::operator<<(poVar6,_Var2);
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(&local_a8);
    __str._M_len = (ppVar8->first).func_name._M_len;
    __str._M_str = (ppVar8->first).func_name._M_str;
    pbVar10 = std::operator<<(poVar6,__str);
    poVar6 = std::operator<<(pbVar10,"  ");
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(&local_a8);
    __str_00._M_len = (ppVar8->first).file_name._M_len;
    __str_00._M_str = (ppVar8->first).file_name._M_str;
    pbVar10 = std::operator<<(poVar6,__str_00);
    poVar6 = std::operator<<(pbVar10,":");
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
             ::operator->(&local_a8);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ppVar8->first).line_no);
    std::operator<<(poVar6,'\n');
    __gnu_cxx::
    __normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>_>
    ::operator++(&__end2_1);
  }
  sVar11 = std::ostream::flush();
  return sVar11;
}

Assistant:

void write(std::ostream& os) const
        {
            auto int_width = [](auto n)
            {
                if (n == 0)
                    return 1;
                if (n < 0)
                    return int(std::ceil(std::log10(-n)) + 1);
                return int(std::ceil(std::log10(n)));
            };

            auto float_width = [](auto n)
            {
                if (n < 0)
                    return int(std::ceil(std::log10(-n)) + 6);
                if (n < 1)
                    return 6;
                return int(std::ceil(std::log10(n))) + 5;
            };

            int widths[5] = {5, 3, 3, 3, 8};
            for (const auto& it : sequence_)
            {
                widths[0] = std::max(widths[0], int_width(it->second.count()));
                widths[1] = std::max(widths[1], float_width(it->second.acc_time()));
                widths[2] = std::max(widths[2], float_width(it->second.min_time()));
                widths[3] = std::max(widths[3], float_width(it->second.max_time()));
                widths[4] = std::max(widths[4], int(it->first.func_name.size()));
            }
            using std::left, std::right, std::setw;
            os << right << setw(widths[0]) << "calls"
               << " " << setw(widths[1]) << "sum"
               << " " << setw(widths[2]) << "min"
               << " " << setw(widths[3]) << "max"
               << left << "  " << setw(widths[4]) << "function"
               << "  file\n";

            os << std::setprecision(4) << std::fixed;
            for (auto it : sequence_)
            {
                os << right << setw(widths[0]) << it->second.count()
                   << " " << setw(widths[1]) << it->second.acc_time()
                   << " " << setw(widths[2]) << it->second.min_time()
                   << " " << setw(widths[3]) << it->second.max_time()
                   << "  " << left << setw(widths[4]) << it->first.func_name
                   << "  " << it->first.file_name
                   #ifdef _MSC_VER
                   << "(" << it->first.line_no << ")"
                   #else
                   << ":" << it->first.line_no
                   #endif
                   << '\n';
            }
            os.flush();
        }